

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O0

vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> * xmrig::OclPlatform::get(void)

{
  bool bVar1;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *pvVar2;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *in_RDI;
  size_t i;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> platforms;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *out;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *__args;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *in_stack_ffffffffffffffc0;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *pvVar3;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *in_stack_ffffffffffffffe0;
  
  __args = in_RDI;
  OclLib::getPlatformIDs();
  in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
  std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::vector
            ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)0x220e1f);
  bVar1 = std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::empty
                    (in_stack_ffffffffffffffc0);
  if (!bVar1) {
    std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::size
              ((vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)
               &stack0xffffffffffffffe0);
    std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::reserve
              (in_stack_ffffffffffffffe0,
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    pvVar3 = (vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)0x0;
    while (in_stack_ffffffffffffffc0 = pvVar3,
          pvVar2 = (vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)
                   std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::size
                             ((vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)
                              &stack0xffffffffffffffe0), pvVar3 < pvVar2) {
      std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::operator[]
                ((vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)
                 &stack0xffffffffffffffe0,(size_type)in_stack_ffffffffffffffc0);
      std::vector<xmrig::OclPlatform,std::allocator<xmrig::OclPlatform>>::
      emplace_back<unsigned_long&,_cl_platform_id*const&>
                ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)
                 in_stack_ffffffffffffffc0,(unsigned_long *)__args,(_cl_platform_id **)in_RDI);
      pvVar3 = (vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)
               ((long)&(((_Vector_base<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)
                        &in_stack_ffffffffffffffc0->
                         super__Vector_base<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>)
                       ->_M_impl).super__Vector_impl_data._M_start + 1);
    }
  }
  std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::~vector
            (in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

std::vector<xmrig::OclPlatform> xmrig::OclPlatform::get()
{
    const std::vector<cl_platform_id> platforms = OclLib::getPlatformIDs();
    std::vector<OclPlatform> out;
    if (platforms.empty()) {
        return out;
    }

    out.reserve(platforms.size());

    for (size_t i = 0; i < platforms.size(); i++) {
        out.emplace_back(i, platforms[i]);
    }

    return out;
}